

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

void rf_gfx_rotatef(float angleDeg,float x,float y,float z)

{
  rf_mat *prVar1;
  rf_mat left;
  float fVar2;
  rf_vec3 axis;
  rf_mat result;
  rf_mat local_f8;
  float local_b8;
  float local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  local_f8.m8 = 0.0;
  local_f8.m12 = 0.0;
  local_f8.m9 = 0.0;
  local_f8.m13 = 0.0;
  local_f8.m2 = 0.0;
  local_f8.m6 = 0.0;
  local_f8.m3 = 0.0;
  local_f8.m7 = 0.0;
  local_f8.m0 = 1.0;
  local_f8.m4 = 0.0;
  local_f8.m1 = 0.0;
  local_f8.m5 = 1.0;
  local_f8.m10 = 1.0;
  local_f8.m14 = 0.0;
  local_f8.m11 = 0.0;
  local_f8.m15 = 1.0;
  fVar2 = z * z + x * x + y * y;
  if (fVar2 < 0.0) {
    local_b8 = y;
    local_a8 = x;
    fVar2 = sqrtf(fVar2);
    y = local_b8;
    x = local_a8;
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar2 = (float)(-(uint)(fVar2 == 0.0) & 0x3f800000 | ~-(uint)(fVar2 == 0.0) & (uint)(1.0 / fVar2))
  ;
  axis.y = y * fVar2;
  axis.x = x * fVar2;
  axis.z = fVar2 * z;
  rf_mat_rotate(&local_f8,axis,angleDeg * 0.017453292);
  prVar1 = (rf__ctx->field_0).current_matrix;
  local_98._0_4_ = prVar1->m0;
  local_98._4_4_ = prVar1->m4;
  uStack_90._0_4_ = prVar1->m8;
  uStack_90._4_4_ = prVar1->m12;
  local_88._0_4_ = prVar1->m1;
  local_88._4_4_ = prVar1->m5;
  uStack_80._0_4_ = prVar1->m9;
  uStack_80._4_4_ = prVar1->m13;
  local_78._0_4_ = prVar1->m2;
  local_78._4_4_ = prVar1->m6;
  uStack_70._0_4_ = prVar1->m10;
  uStack_70._4_4_ = prVar1->m14;
  local_68._0_4_ = prVar1->m3;
  local_68._4_4_ = prVar1->m7;
  uStack_60._0_4_ = prVar1->m11;
  uStack_60._4_4_ = prVar1->m15;
  left.m8 = local_f8.m8;
  left.m12 = local_f8.m12;
  left.m0 = local_f8.m0;
  left.m4 = local_f8.m4;
  left.m1 = local_f8.m1;
  left.m5 = local_f8.m5;
  left.m9 = local_f8.m9;
  left.m13 = local_f8.m13;
  left.m2 = local_f8.m2;
  left.m6 = local_f8.m6;
  left.m10 = local_f8.m10;
  left.m14 = local_f8.m14;
  left.m3 = local_f8.m3;
  left.m7 = local_f8.m7;
  left.m11 = local_f8.m11;
  left.m15 = local_f8.m15;
  rf_mat_mul(left,*prVar1);
  prVar1->m3 = (float)(undefined4)local_20;
  prVar1->m7 = (float)local_20._4_4_;
  prVar1->m11 = (float)(undefined4)uStack_18;
  prVar1->m15 = (float)uStack_18._4_4_;
  prVar1->m2 = (float)(undefined4)local_30;
  prVar1->m6 = (float)local_30._4_4_;
  prVar1->m10 = (float)(undefined4)uStack_28;
  prVar1->m14 = (float)uStack_28._4_4_;
  prVar1->m1 = (float)(undefined4)local_40;
  prVar1->m5 = (float)local_40._4_4_;
  prVar1->m9 = (float)(undefined4)uStack_38;
  prVar1->m13 = (float)uStack_38._4_4_;
  prVar1->m0 = (float)(undefined4)local_50;
  prVar1->m4 = (float)local_50._4_4_;
  prVar1->m8 = (float)(undefined4)uStack_48;
  prVar1->m12 = (float)uStack_48._4_4_;
  return;
}

Assistant:

RF_API void rf_gfx_rotatef(float angleDeg, float x, float y, float z)
{
    rf_mat mat_rotation = rf_mat_identity();

    rf_vec3 axis = (rf_vec3){x, y, z };
    mat_rotation = rf_mat_rotate(rf_vec3_normalize(axis), angleDeg * RF_DEG2RAD);

    // NOTE: We transpose matrix with multiplication order
    *rf_ctx.current_matrix = rf_mat_mul(mat_rotation, *rf_ctx.current_matrix);
}